

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

void __thiscall
icu_63::SpoofImpl::setAllowedLocales(SpoofImpl *this,char *localesList,UErrorCode *status)

{
  UnicodeSet *this_00;
  UBool UVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  UnicodeSet *pUVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  void *__child_stack;
  char *pcVar7;
  void *in_R8;
  bool bVar8;
  UnicodeSet *local_168;
  char *tmpLocalesList;
  UnicodeSet tempSet;
  char *locale;
  char *trimmedEnd;
  int32_t localeListCount;
  char *localesListEnd;
  char *locEnd;
  char *locStart;
  UnicodeSet *tmpSet;
  UnicodeSet allowedChars;
  UErrorCode *status_local;
  char *localesList_local;
  SpoofImpl *this_local;
  UnicodeSet *this_01;
  
  allowedChars._80_8_ = status;
  UnicodeSet::UnicodeSet((UnicodeSet *)&tmpSet);
  sVar3 = strlen(localesList);
  trimmedEnd._4_4_ = 0;
  locEnd = localesList;
  while( true ) {
    pcVar7 = (char *)0x2c;
    localesListEnd = strchr(locEnd,0x2c);
    if (localesListEnd == (char *)0x0) {
      localesListEnd = localesList + sVar3;
    }
    for (; locale = localesListEnd, *locEnd == ' '; locEnd = locEnd + 1) {
    }
    do {
      locale = locale + -1;
      bVar8 = false;
      if (locEnd < locale) {
        bVar8 = *locale == ' ';
      }
    } while (bVar8);
    if (locale <= locEnd) break;
    pcVar4 = uprv_strndup_63(locEnd,((int)locale - (int)locEnd) + 1);
    trimmedEnd._4_4_ = trimmedEnd._4_4_ + 1;
    pcVar7 = pcVar4;
    addScriptChars(this,pcVar4,(UnicodeSet *)&tmpSet,(UErrorCode *)allowedChars._80_8_);
    uprv_free_63(pcVar4);
    UVar1 = ::U_FAILURE(*(UErrorCode *)allowedChars._80_8_);
    if ((UVar1 != '\0') || (locEnd = localesListEnd + 1, localesList + sVar3 <= locEnd)) break;
  }
  if (trimmedEnd._4_4_ == 0) {
    uprv_free_63(this->fAllowedLocales);
    pcVar4 = uprv_strdup_63("");
    this->fAllowedLocales = pcVar4;
    pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pcVar7);
    tempSet._87_1_ = 0;
    local_168 = (UnicodeSet *)0x0;
    if (pUVar5 != (UnicodeSet *)0x0) {
      tempSet._87_1_ = 1;
      pcVar7 = (char *)0x0;
      UnicodeSet::UnicodeSet(pUVar5,0,0x10ffff);
      local_168 = pUVar5;
    }
    if ((this->fAllowedLocales == (char *)0x0) || (local_168 == (UnicodeSet *)0x0)) {
      *(undefined4 *)allowedChars._80_8_ = 7;
      tempSet.fFlags = '\x01';
      tempSet._81_3_ = 0;
    }
    else {
      UnicodeSet::freeze(local_168);
      pUVar5 = this->fAllowedCharsSet;
      if (pUVar5 != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet(pUVar5);
        UMemory::operator_delete((UMemory *)pUVar5,pcVar7);
      }
      this->fAllowedCharsSet = local_168;
      this->fChecks = this->fChecks & 0xffffffbf;
      tempSet.fFlags = '\x01';
      tempSet._81_3_ = 0;
    }
  }
  else {
    UnicodeSet::UnicodeSet((UnicodeSet *)&tmpLocalesList);
    UnicodeSet::applyIntPropertyValue
              ((UnicodeSet *)&tmpLocalesList,UCHAR_SCRIPT,0,(UErrorCode *)allowedChars._80_8_);
    UnicodeSet::addAll((UnicodeSet *)&tmpSet,(UnicodeSet *)&tmpLocalesList);
    uVar6 = allowedChars._80_8_;
    UnicodeSet::applyIntPropertyValue
              ((UnicodeSet *)&tmpLocalesList,UCHAR_SCRIPT,1,(UErrorCode *)allowedChars._80_8_);
    iVar2 = (int)uVar6;
    pUVar5 = (UnicodeSet *)&tmpLocalesList;
    UnicodeSet::addAll((UnicodeSet *)&tmpSet,pUVar5);
    UVar1 = ::U_FAILURE(*(UErrorCode *)allowedChars._80_8_);
    if (UVar1 == '\0') {
      iVar2 = UnicodeSet::clone((UnicodeSet *)&tmpSet,(__fn *)pUVar5,__child_stack,iVar2,in_R8);
      this_01 = (UnicodeSet *)CONCAT44(extraout_var,iVar2);
      pcVar7 = uprv_strdup_63(localesList);
      if ((this_01 == (UnicodeSet *)0x0) || (pcVar7 == (char *)0x0)) {
        *(undefined4 *)allowedChars._80_8_ = 7;
        tempSet.fFlags = '\x01';
        tempSet._81_3_ = 0;
      }
      else {
        uprv_free_63(this->fAllowedLocales);
        this->fAllowedLocales = pcVar7;
        UnicodeSet::freeze(this_01);
        this_00 = this->fAllowedCharsSet;
        if (this_00 != (UnicodeSet *)0x0) {
          UnicodeSet::~UnicodeSet(this_00);
          UMemory::operator_delete((UMemory *)this_00,pUVar5);
        }
        this->fAllowedCharsSet = this_01;
        this->fChecks = this->fChecks | 0x40;
        tempSet.fFlags = '\0';
        tempSet._81_3_ = 0;
      }
    }
    else {
      tempSet.fFlags = '\x01';
      tempSet._81_3_ = 0;
    }
    UnicodeSet::~UnicodeSet((UnicodeSet *)&tmpLocalesList);
  }
  UnicodeSet::~UnicodeSet((UnicodeSet *)&tmpSet);
  return;
}

Assistant:

void SpoofImpl::setAllowedLocales(const char *localesList, UErrorCode &status) {
    UnicodeSet    allowedChars;
    UnicodeSet    *tmpSet = NULL;
    const char    *locStart = localesList;
    const char    *locEnd = NULL;
    const char    *localesListEnd = localesList + uprv_strlen(localesList);
    int32_t        localeListCount = 0;   // Number of locales provided by caller.

    // Loop runs once per locale from the localesList, a comma separated list of locales.
    do {
        locEnd = uprv_strchr(locStart, ',');
        if (locEnd == NULL) {
            locEnd = localesListEnd;
        }
        while (*locStart == ' ') {
            locStart++;
        }
        const char *trimmedEnd = locEnd-1;
        while (trimmedEnd > locStart && *trimmedEnd == ' ') {
            trimmedEnd--;
        }
        if (trimmedEnd <= locStart) {
            break;
        }
        const char *locale = uprv_strndup(locStart, (int32_t)(trimmedEnd + 1 - locStart));
        localeListCount++;

        // We have one locale from the locales list.
        // Add the script chars for this locale to the accumulating set of allowed chars.
        // If the locale is no good, we will be notified back via status.
        addScriptChars(locale, &allowedChars, status);
        uprv_free((void *)locale);
        if (U_FAILURE(status)) {
            break;
        }
        locStart = locEnd + 1;
    } while (locStart < localesListEnd);

    // If our caller provided an empty list of locales, we disable the allowed characters checking
    if (localeListCount == 0) {
        uprv_free((void *)fAllowedLocales);
        fAllowedLocales = uprv_strdup("");
        tmpSet = new UnicodeSet(0, 0x10ffff);
        if (fAllowedLocales == NULL || tmpSet == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        } 
        tmpSet->freeze();
        delete fAllowedCharsSet;
        fAllowedCharsSet = tmpSet;
        fChecks &= ~USPOOF_CHAR_LIMIT;
        return;
    }

        
    // Add all common and inherited characters to the set of allowed chars.
    UnicodeSet tempSet;
    tempSet.applyIntPropertyValue(UCHAR_SCRIPT, USCRIPT_COMMON, status);
    allowedChars.addAll(tempSet);
    tempSet.applyIntPropertyValue(UCHAR_SCRIPT, USCRIPT_INHERITED, status);
    allowedChars.addAll(tempSet);
    
    // If anything went wrong, we bail out without changing
    // the state of the spoof checker.
    if (U_FAILURE(status)) {
        return;
    }

    // Store the updated spoof checker state.
    tmpSet = static_cast<UnicodeSet *>(allowedChars.clone());
    const char *tmpLocalesList = uprv_strdup(localesList);
    if (tmpSet == NULL || tmpLocalesList == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    uprv_free((void *)fAllowedLocales);
    fAllowedLocales = tmpLocalesList;
    tmpSet->freeze();
    delete fAllowedCharsSet;
    fAllowedCharsSet = tmpSet;
    fChecks |= USPOOF_CHAR_LIMIT;
}